

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void mouse_callback(GLFWwindow *window,double xpos,double ypos)

{
  float fVar1;
  float fVar2;
  vec3 front;
  anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2 local_14;
  
  if (firstMouse) {
    lastX = (float)xpos;
    lastY = (float)ypos;
    firstMouse = false;
  }
  yaw = (float)(xpos - (double)lastX) * 0.1 + yaw;
  fVar2 = (float)((double)lastY - ypos) * 0.1 + pitch;
  fVar1 = 89.0;
  if (fVar2 <= 89.0) {
    fVar1 = fVar2;
  }
  pitch = -89.0;
  if (-89.0 <= fVar1) {
    pitch = fVar1;
  }
  lastX = (float)xpos;
  lastY = (float)ypos;
  fVar1 = cosf(yaw * 0.017453292);
  fVar2 = cosf(pitch * 0.017453292);
  local_14.field_0.x = fVar2 * fVar1;
  local_14.field_0.y = sinf(pitch * 0.017453292);
  fVar1 = sinf(yaw * 0.017453292);
  fVar2 = cosf(pitch * 0.017453292);
  local_14.field_0.z = fVar2 * fVar1;
  cameraFront.field_0 =
       (anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2)
       glm::detail::compute_normalize<float,_(glm::precision)0,_glm::tvec3,_false>::call
                 ((tvec3<float,_(glm::precision)0> *)&local_14.field_0);
  return;
}

Assistant:

void mouse_callback(GLFWwindow* window, double xpos, double ypos)
{
  if (firstMouse){
    lastX = xpos;
    lastY = ypos;
    firstMouse = false;
  }

  float xoffset = xpos - lastX;
  float yoffset = lastY - ypos; // reversed since y-coordinates go from bottom to top
  lastX = xpos;
  lastY = ypos;

  float sensitivity = 0.1f; // change this value to your liking
  xoffset *= sensitivity;
  yoffset *= sensitivity;

  yaw += xoffset;
  pitch += yoffset;

  // make sure that when pitch is out of bounds, screen doesn't get flipped
  if (pitch > 89.0f)
    pitch = 89.0f;
  if (pitch < -89.0f)
    pitch = -89.0f;

  glm::vec3 front;
  front.x = cos(glm::radians(yaw)) * cos(glm::radians(pitch));
  front.y = sin(glm::radians(pitch));
  front.z = sin(glm::radians(yaw)) * cos(glm::radians(pitch));
  cameraFront = glm::normalize(front);
}